

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_flush(BGZF *fp)

{
  int iVar1;
  ssize_t sVar2;
  int block_length;
  BGZF *fp_local;
  
  if ((*(int *)fp << 0xe) >> 0x1e == 0) {
    fp_local._4_4_ = 0;
  }
  else if (fp->mt == (bgzf_mtaux_t *)0x0) {
    while (0 < fp->block_offset) {
      if (fp->idx_build_otf != 0) {
        bgzf_index_add_block(fp);
        fp->idx->ublock_addr = (long)fp->block_offset + fp->idx->ublock_addr;
      }
      iVar1 = deflate_block(fp,fp->block_offset);
      if (iVar1 < 0) {
        return -1;
      }
      sVar2 = hwrite(fp->fp,fp->compressed_block,(long)iVar1);
      if (sVar2 != iVar1) {
        *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 4;
        return -1;
      }
      fp->block_address = (long)iVar1 + fp->block_address;
    }
    fp_local._4_4_ = 0;
  }
  else {
    if (fp->block_offset != 0) {
      mt_queue(fp);
    }
    fp_local._4_4_ = mt_flush_queue(fp);
  }
  return fp_local._4_4_;
}

Assistant:

int bgzf_flush(BGZF *fp)
{
    if (!fp->is_write) return 0;
#ifdef BGZF_MT
    if (fp->mt) {
        if (fp->block_offset) mt_queue(fp); // guaranteed that assertion does not fail
        return mt_flush_queue(fp);
    }
#endif
    while (fp->block_offset > 0) {
        if ( fp->idx_build_otf )
        {
            bgzf_index_add_block(fp);
            fp->idx->ublock_addr += fp->block_offset;
        }
        int block_length = deflate_block(fp, fp->block_offset);
        if (block_length < 0) return -1;
        if (hwrite(fp->fp, fp->compressed_block, block_length) != block_length) {
            fp->errcode |= BGZF_ERR_IO; // possibly truncated file
            return -1;
        }
        fp->block_address += block_length;
    }
    return 0;
}